

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_helper.h
# Opt level: O0

void spdlog::details::fmt_helper::pad3<unsigned_int>(uint n,memory_buf_t *dest)

{
  char cVar1;
  char cVar2;
  buffer<char> *in_RSI;
  uint in_EDI;
  memory_buf_t *in_stack_00000018;
  uint in_stack_00000024;
  undefined5 in_stack_ffffffffffffffe8;
  undefined1 in_stack_ffffffffffffffed;
  undefined1 in_stack_ffffffffffffffee;
  
  if (in_EDI < 1000) {
    cVar1 = (char)((ulong)in_EDI / 100) + '0';
    ::fmt::v8::detail::buffer<char>::push_back
              (in_RSI,(char *)CONCAT17(cVar1,CONCAT16(in_stack_ffffffffffffffee,
                                                      CONCAT15(in_stack_ffffffffffffffed,
                                                               in_stack_ffffffffffffffe8))));
    cVar2 = (char)((in_EDI % 100) / 10) + '0';
    ::fmt::v8::detail::buffer<char>::push_back
              (in_RSI,(char *)CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15(in_stack_ffffffffffffffed,
                                                                     in_stack_ffffffffffffffe8))));
    ::fmt::v8::detail::buffer<char>::push_back
              (in_RSI,(char *)CONCAT17(cVar1,CONCAT16(cVar2,CONCAT15((char)((ulong)(in_EDI % 100) %
                                                                           10) + '0',
                                                                     in_stack_ffffffffffffffe8))));
  }
  else {
    append_int<unsigned_int>(in_stack_00000024,in_stack_00000018);
  }
  return;
}

Assistant:

inline void pad3(T n, memory_buf_t &dest)
{
    static_assert(std::is_unsigned<T>::value, "pad3 must get unsigned T");
    if (n < 1000)
    {
        dest.push_back(static_cast<char>(n / 100 + '0'));
        n = n % 100;
        dest.push_back(static_cast<char>((n / 10) + '0'));
        dest.push_back(static_cast<char>((n % 10) + '0'));
    }
    else
    {
        append_int(n, dest);
    }
}